

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

char * UTF_fgets<char>(char *str,int count,FILE *fp)

{
  int iVar1;
  size_t sVar2;
  char *local_48;
  long diff;
  size_t cw;
  size_t i;
  FILE *fp_local;
  int count_local;
  char *str_local;
  
  if ((count < 1) || (iVar1 = feof((FILE *)fp), iVar1 != 0)) {
    str_local = (char *)0x0;
  }
  else {
    sVar2 = fread(str,1,(long)count,(FILE *)fp);
    if (sVar2 == 0) {
      str_local = (char *)0x0;
    }
    else {
      for (cw = 0; cw < sVar2; cw = cw + 1) {
        if (str[cw] == '\n') {
          if ((cw == 0) || (str[cw - 1] != '\r')) {
            if (cw + 1 != (long)count) {
              cw = cw + 1;
            }
            str[cw] = '\0';
          }
          else {
            str[cw - 1] = '\n';
            str[cw] = '\0';
            cw = cw + 1;
          }
          break;
        }
      }
      if (cw == (long)count) {
        cw = cw - 1;
        str[cw] = '\0';
      }
      else if ((cw == sVar2) && (sVar2 != (long)count)) {
        str[cw] = '\0';
      }
      if ((cw == sVar2) || (iVar1 = fseek((FILE *)fp,cw - sVar2,1), iVar1 == 0)) {
        local_48 = str;
        if (*str == '\0') {
          local_48 = (char *)0x0;
        }
        str_local = local_48;
      }
      else {
        str_local = (char *)0x0;
      }
    }
  }
  return str_local;
}

Assistant:

inline UT *
UTF_fgets(UT *str, int count, FILE *fp)
{
    size_t i, cw;
    long diff;
    if (count <= 0 || feof(fp))
        return NULL;

    cw = fread(str, sizeof(UT), UTF_STATIC_CAST(size_t, count), fp);
    if (!cw)
        return NULL;

    for (i = 0; i < cw; ++i)
    {
        if (str[i] == '\n')
        {
            if (i && str[i - 1] == '\r')
            {
                str[i - 1] = '\n';
                str[i] = 0;
                ++i;
            }
            else
            {
                if (i + 1 != count)
                {
                    ++i;
                }
                str[i] = 0;
            }
            break;
        }
    }

    if (i == count)
    {
        --i;
        str[i] = 0;
    }
    else if (i == cw && cw != count)
    {
        str[i] = 0;
    }

    if (i != cw)
    {
        diff = UTF_STATIC_CAST(long, i) - UTF_STATIC_CAST(long, cw);
        diff *= UTF_STATIC_CAST(long, sizeof(UT));
        if (fseek(fp, diff, SEEK_CUR) != 0)
            return NULL;
    }
    return str[0] ? str : NULL;
}